

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O2

bool __thiscall
QSqlQueryModel::setHeaderData
          (QSqlQueryModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  QList<QHash<int,_QVariant>_> *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer pQVar4;
  QVariant *this_01;
  long in_FS_OFFSET;
  int role_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  role_local = role;
  if (-1 < section && orientation == Horizontal) {
    lVar1 = *(long *)&this->field_0x8;
    iVar3 = (**(code **)(*(long *)this + 0x80))();
    if (section < iVar3) {
      this_00 = (QList<QHash<int,_QVariant>_> *)(lVar1 + 0x110);
      if (*(ulong *)(lVar1 + 0x120) <= (ulong)(uint)section) {
        iVar3 = 0xf;
        if (0xf < (uint)section) {
          iVar3 = section;
        }
        QList<QHash<int,_QVariant>_>::resize(this_00,(ulong)(iVar3 + 1));
      }
      pQVar4 = QList<QHash<int,_QVariant>_>::data(this_00);
      this_01 = QHash<int,_QVariant>::operator[](pQVar4 + (uint)section,&role_local);
      QVariant::operator=(this_01,value);
      QAbstractItemModel::headerDataChanged((Orientation)this,1,section);
      bVar2 = true;
      goto LAB_0012b083;
    }
  }
  bVar2 = false;
LAB_0012b083:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQueryModel::setHeaderData(int section, Qt::Orientation orientation,
                                   const QVariant &value, int role)
{
    Q_D(QSqlQueryModel);
    if (orientation != Qt::Horizontal || section < 0 || columnCount() <= section)
        return false;

    if (d->headers.size() <= section)
        d->headers.resize(qMax(section + 1, 16));
    d->headers[section][role] = value;
    emit headerDataChanged(orientation, section, section);
    return true;
}